

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O1

void transmaskwallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
                      double yrepeat,_func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  long lVar1;
  short sVar2;
  short sVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  float fVar7;
  fixed_t fVar8;
  short *psVar9;
  short *psVar10;
  float *pfVar11;
  fixed_t *pfVar12;
  bool bVar13;
  DWORD DVar14;
  int iVar15;
  int iVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  BYTE *pBVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  long lVar25;
  bool bVar26;
  _func_fixed_t *tmvline1;
  _func_void *tmvline4;
  float local_e4;
  BYTE *local_e0;
  _func_fixed_t *local_b0;
  int local_a8 [4];
  uint local_98 [6];
  ulong local_80;
  short *local_78;
  short *local_70;
  float *local_68;
  fixed_t *local_60;
  double local_58;
  BYTE *local_50;
  float *local_48;
  BYTE *local_40;
  _func_void *local_38;
  
  if (rw_pic->UseType != '\r') {
    local_e4 = rw_light - rw_lightstep;
    local_78 = uwal;
    local_70 = dwal;
    local_68 = swal;
    local_60 = lwal;
    local_58 = yrepeat;
    bVar13 = R_GetTransMaskDrawers(&local_b0,&local_38);
    if (bVar13) {
      iVar22 = 0x20 - (uint)rw_pic->HeightBits;
      setuptmvline(iVar22);
      pfVar12 = local_60;
      psVar10 = local_70;
      psVar9 = local_78;
      fVar8 = rw_offset;
      local_50 = basecolormap->Maps;
      lVar23 = (long)x1;
      bVar13 = fixedcolormap != (lighttable_t *)0x0;
      bVar26 = -1 < fixedlightlev;
      local_e0 = dc_destorg + lVar23;
      if (bVar26 || bVar13) {
        palookupoffse[0] = dc_colormap;
        palookupoffse[1] = dc_colormap;
        palookupoffse[2] = dc_colormap;
        palookupoffse[3] = dc_colormap;
      }
      bVar17 = (byte)iVar22;
      local_80 = (ulong)(uint)x2;
      if (((ulong)local_e0 & 3) == 0 || x2 <= x1) {
        uVar20 = (ulong)local_98[0];
      }
      else {
        dVar5 = 6755399441055744.0 / (double)(1 << (bVar17 & 0x1f));
        local_48 = local_68 + lVar23;
        pBVar21 = dc_destorg + lVar23 + 1;
        lVar25 = 0;
        local_40 = pBVar21;
        do {
          local_e4 = local_e4 + rw_lightstep;
          sVar2 = psVar9[lVar23 + lVar25];
          uVar20 = (ulong)sVar2;
          sVar3 = psVar10[lVar23 + lVar25];
          if (sVar2 < sVar3) {
            if (!bVar26 && !bVar13) {
              dVar4 = (double)local_e4;
              if (24.0 <= dVar4) {
                dVar4 = 24.0;
              }
              iVar22 = wallshade - SUB84(dVar4 + 103079215104.0,0) >> 0x10;
              if (0x1e < iVar22) {
                iVar22 = 0x1f;
              }
              if (iVar22 < 1) {
                iVar22 = 0;
              }
              dc_colormap = local_50 + (uint)(iVar22 << 8);
            }
            dc_source = (*getcol)(rw_pic,pfVar12[lVar23 + lVar25] + fVar8 >> 0x10);
            dc_dest = local_e0 + ylookup[uVar20] + lVar25;
            dc_count = (int)sVar3 - (int)sVar2;
            dc_iscale = SUB84((double)local_48[lVar25] * local_58 + dVar5,0);
            dc_texturefrac =
                 SUB84(dc_texturemid + dVar5 +
                       (((double)(int)sVar2 + 0.5) - CenterY) * (double)local_48[lVar25] * local_58,
                       0);
            (*local_b0)();
            pBVar21 = local_40;
          }
          lVar1 = lVar25 + 1;
        } while ((lVar25 + lVar23 + 1 < (long)x2) &&
                (iVar22 = (int)lVar25, lVar25 = lVar1, (iVar22 + (int)pBVar21 & 3U) != 0));
        x1 = x1 + (int)lVar1;
        local_e0 = local_e0 + lVar1;
        x2 = (int)local_80;
        local_a8[0] = (int)sVar3;
      }
      local_98[0] = (uint)uVar20;
      local_48 = (float *)CONCAT44(local_48._4_4_,x2 + -3);
      if (x1 < x2 + -3) {
        dVar5 = 6755399441055744.0 / (double)(1 << (bVar17 & 0x1f));
        iVar22 = x1 + 3;
        do {
          pfVar12 = local_60;
          pfVar11 = local_68;
          psVar10 = local_70;
          psVar9 = local_78;
          lVar23 = 4;
          bVar24 = 0;
          do {
            sVar2 = psVar9[(long)iVar22 + lVar23 + -4];
            local_a8[lVar23 + 3] = (int)sVar2;
            sVar3 = psVar10[(long)iVar22 + lVar23 + -4];
            local_a8[lVar23 + -1] = (int)sVar3;
            if (sVar2 < sVar3) {
              pBVar21 = (*getcol)(rw_pic,pfVar12[(long)iVar22 + lVar23 + -4] + fVar8 >> 0x10);
              palookupoffse[lVar23 + 3] = pBVar21;
              dVar4 = (double)pfVar11[(long)iVar22 + lVar23 + -4] * local_58 + dVar5;
              vplce[lVar23 + 3] = SUB84(dVar4,0);
              *(int *)(lVar23 * 4 + 0x88d08c) =
                   SUB84(dc_texturemid + dVar5 +
                         (((double)(int)sVar2 + 0.5) - CenterY) *
                         (double)((ulong)dVar4 & 0xffffffff),0);
            }
            else {
              bVar24 = bVar24 + (char)(1 << ((char)lVar23 - 1U & 0x1f));
            }
            uVar20 = local_80;
            fVar7 = rw_lightstep;
            iVar16 = wallshade;
            lVar23 = lVar23 + -1;
          } while (lVar23 != 0);
          if (bVar24 == 0xf) {
            local_e4 = local_e4 + rw_lightstep * 4.0;
LAB_0031129c:
            x2 = (int)uVar20;
          }
          else {
            if (!bVar26 && !bVar13) {
              lVar23 = 0;
              do {
                local_e4 = local_e4 + fVar7;
                dVar4 = (double)local_e4;
                if (24.0 <= dVar4) {
                  dVar4 = 24.0;
                }
                iVar18 = iVar16 - SUB84(dVar4 + 103079215104.0,0) >> 0x10;
                if (0x1e < iVar18) {
                  iVar18 = 0x1f;
                }
                if (iVar18 < 1) {
                  iVar18 = 0;
                }
                palookupoffse[lVar23] = local_50 + (uint)(iVar18 << 8);
                lVar23 = lVar23 + 1;
              } while (lVar23 != 4);
            }
            uVar6 = local_98[1];
            if ((int)local_98[1] < (int)local_98[0]) {
              uVar6 = local_98[0];
            }
            uVar19 = local_98[3];
            if ((int)local_98[3] < (int)local_98[2]) {
              uVar19 = local_98[2];
            }
            if ((int)uVar19 < (int)uVar6) {
              uVar19 = uVar6;
            }
            iVar16 = local_a8[1];
            if (local_a8[0] < local_a8[1]) {
              iVar16 = local_a8[0];
            }
            iVar18 = local_a8[3];
            if (local_a8[2] < local_a8[3]) {
              iVar18 = local_a8[2];
            }
            if (iVar16 < iVar18) {
              iVar18 = iVar16;
            }
            if ((bVar24 != 0) || (iVar18 <= (int)uVar19)) {
              lVar23 = 0;
              do {
                if ((bVar24 & 1) == 0) {
                  dc_count = local_a8[lVar23] - local_a8[lVar23 + 4];
                  dc_dest = local_e0 + lVar23 + ylookup[local_a8[lVar23 + 4]];
                  dc_iscale = vince[lVar23];
                  dc_colormap = palookupoffse[lVar23];
                  dc_texturefrac = vplce[lVar23];
                  dc_source = bufplce[lVar23];
                  (*local_b0)();
                }
                bVar24 = (char)bVar24 >> 1;
                lVar23 = lVar23 + 1;
              } while (lVar23 != 4);
              goto LAB_0031129c;
            }
            lVar23 = 0;
            do {
              iVar16 = local_a8[lVar23 + 4];
              if (iVar16 < (int)uVar19) {
                dc_count = uVar19 - iVar16;
                dc_dest = local_e0 + lVar23 + ylookup[iVar16];
                dc_iscale = vince[lVar23];
                dc_colormap = palookupoffse[lVar23];
                dc_texturefrac = vplce[lVar23];
                dc_source = bufplce[lVar23];
                DVar14 = (*local_b0)();
                vplce[lVar23] = DVar14;
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
            if (iVar18 - uVar19 != 0 && (int)uVar19 <= iVar18) {
              dc_dest = local_e0 + ylookup[(int)uVar19];
              dc_count = iVar18 - uVar19;
              (*local_38)();
            }
            iVar16 = ylookup[iVar18];
            lVar23 = 0;
            do {
              iVar15 = local_a8[lVar23] - iVar18;
              if (iVar15 != 0 && iVar18 <= local_a8[lVar23]) {
                dc_iscale = vince[lVar23];
                dc_colormap = palookupoffse[0];
                dc_texturefrac = vplce[lVar23];
                dc_source = bufplce[lVar23];
                dc_dest = local_e0 + lVar23 + iVar16;
                dc_count = iVar15;
                (*local_b0)();
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
            x2 = (int)local_80;
          }
          x1 = x1 + 4;
          local_e0 = local_e0 + 4;
          iVar22 = iVar22 + 4;
        } while (x1 < (int)local_48);
      }
      pfVar12 = local_60;
      pfVar11 = local_68;
      psVar10 = local_70;
      psVar9 = local_78;
      if (x1 < x2) {
        dVar5 = 6755399441055744.0 / (double)(1 << (bVar17 & 0x1f));
        lVar23 = 0;
        do {
          local_e4 = local_e4 + rw_lightstep;
          sVar2 = psVar9[x1 + lVar23];
          uVar20 = (ulong)sVar2;
          iVar22 = (int)psVar10[x1 + lVar23];
          if (sVar2 < psVar10[x1 + lVar23]) {
            if (!bVar26 && !bVar13) {
              dVar4 = (double)local_e4;
              if (24.0 <= dVar4) {
                dVar4 = 24.0;
              }
              iVar16 = wallshade - SUB84(dVar4 + 103079215104.0,0) >> 0x10;
              if (0x1e < iVar16) {
                iVar16 = 0x1f;
              }
              if (iVar16 < 1) {
                iVar16 = 0;
              }
              dc_colormap = local_50 + (uint)(iVar16 << 8);
            }
            dc_source = (*getcol)(rw_pic,pfVar12[x1 + lVar23] + fVar8 >> 0x10);
            dc_dest = local_e0 + ylookup[uVar20] + lVar23;
            dc_count = iVar22 - sVar2;
            dc_iscale = SUB84((double)pfVar11[x1 + lVar23] * local_58 + dVar5,0);
            dc_texturefrac =
                 SUB84(dc_texturemid + dVar5 +
                       (((double)(int)sVar2 + 0.5) - CenterY) *
                       (double)pfVar11[x1 + lVar23] * local_58,0);
            (*local_b0)();
          }
          lVar23 = lVar23 + 1;
        } while (x2 - x1 != (int)lVar23);
      }
      else {
        uVar20 = (ulong)local_98[0];
        iVar22 = local_a8[0];
      }
      local_98[0] = (uint)uVar20;
      local_a8[0] = iVar22;
      NetUpdate();
    }
    else {
      maskwallscan(x1,x2,local_78,local_70,local_68,local_60,local_58,getcol);
    }
  }
  return;
}

Assistant:

void transmaskwallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
	double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	fixed_t (*tmvline1)();
	void (*tmvline4)();
	int x, fracbits;
	BYTE *p;
	int y1ve[4], y2ve[4], u4, d4, startx, dax, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

	if (!R_GetTransMaskDrawers (&tmvline1, &tmvline4))
	{
		// The current translucency is unsupported, so draw with regular maskwallscan instead.
		maskwallscan (x1, x2, uwal, dwal, swal, lwal, yrepeat, getcol);
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setuptmvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;
	fixed_t centeryfrac = FLOAT2FIXED(CenterY);

	x = startx = x1;
	p = x + dc_destorg;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && ((size_t)p & 3); ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

	for(; x < x2-3; x += 4, p+= 4)
	{
		bad = 0;
		for (z = 3, dax = x+3; z >= 0; --z, --dax)
		{
			y1ve[z] = uwal[dax];
			y2ve[z] = dwal[dax];
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }

			bufplce[z] = getcol (rw_pic, (lwal[dax] + xoffset) >> FRACBITS);
			iscale = swal[dax] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + vince[z] * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					preptmvline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
					tmvline1();
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				preptmvline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
				vplce[z] = tmvline1();
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+p;
			tmvline4();
		}

		BYTE *i = p+ylookup[d4];
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				preptmvline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
				tmvline1();
			}
		}
	}
	for(; x < x2; ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];
		y2ve[0] = dwal[x];
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

//unclock(WallScanCycles);

	NetUpdate ();
}